

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_embed_optimize_for.pb.cc
# Opt level: O0

bool proto2_unittest::TestEmbedOptimizedForSize::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  RepeatedPtrField<proto2_unittest::TestOptimizedForSize> *t;
  uint32_t *puVar2;
  TestEmbedOptimizedForSize *this_;
  MessageLite *msg_local;
  
  t = _internal_repeated_message((TestEmbedOptimizedForSize *)msg);
  bVar1 = google::protobuf::internal::AllAreInitialized<proto2_unittest::TestOptimizedForSize>(t);
  if (bVar1) {
    puVar2 = google::protobuf::internal::HasBits<1>::operator[]((HasBits<1> *)(msg + 1),0);
    if (((*puVar2 & 1) == 0) ||
       (bVar1 = google::protobuf::MessageLite::IsInitialized
                          ((MessageLite *)msg[3]._vptr_MessageLite), bVar1)) {
      msg_local._7_1_ = true;
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool TestEmbedOptimizedForSize::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const TestEmbedOptimizedForSize&>(msg);
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_repeated_message()))
    return false;
  if ((this_._impl_._has_bits_[0] & 0x00000001u) != 0) {
    if (!this_._impl_.optional_message_->IsInitialized()) return false;
  }
  return true;
}